

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O3

bool __thiscall ON_NurbsCurve::Extend(ON_NurbsCurve *this,ON_Interval *domain)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double in_XMM1_Qa;
  ON_Interval local_40;
  
  iVar4 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if ((char)iVar4 == '\0') {
    iVar4 = this->m_is_rat;
    iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])(this);
    iVar4 = (iVar5 + 1) - (uint)(iVar4 == 0);
    dVar8 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    pdVar6 = ON_Interval::operator[](&local_40,0);
    dVar10 = *pdVar6;
    if (dVar8 < dVar10) {
      ClampEnd(this,0);
      iVar5 = this->m_order;
      iVar1 = this->m_cv_stride;
      pdVar6 = this->m_cv;
      pdVar2 = this->m_knot;
      in_XMM1_Qa = ON_Interval::operator[](domain,0);
      ON_EvaluateNurbsDeBoor(iVar4,iVar5,iVar1,pdVar6,pdVar2,1,0.0,in_XMM1_Qa);
      if (1 < this->m_order) {
        lVar7 = 0;
        do {
          dVar9 = ON_Interval::operator[](domain,0);
          this->m_knot[lVar7] = dVar9;
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)this->m_order + -1);
      }
    }
    dVar9 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_40.m_t[1] = in_XMM1_Qa;
    pdVar6 = ON_Interval::operator[](&local_40,1);
    if (dVar9 < *pdVar6 || dVar9 == *pdVar6) {
      if (dVar10 <= dVar8) goto LAB_0053e8dd;
    }
    else {
      ClampEnd(this,1);
      iVar5 = this->m_order;
      lVar7 = (long)this->m_cv_count - (long)iVar5;
      iVar1 = this->m_cv_stride;
      pdVar6 = this->m_cv + iVar1 * (int)lVar7;
      if (this->m_cv == (double *)0x0) {
        pdVar6 = (double *)0x0;
      }
      pdVar2 = this->m_knot;
      dVar10 = ON_Interval::operator[](domain,1);
      ON_EvaluateNurbsDeBoor(iVar4,iVar5,iVar1,pdVar6,pdVar2 + lVar7,-1,0.0,dVar10);
      iVar4 = ON_KnotCount(this->m_order,this->m_cv_count);
      if (this->m_cv_count <= iVar4) {
        lVar7 = (long)iVar4 + 1;
        do {
          dVar10 = ON_Interval::operator[](domain,1);
          this->m_knot[lVar7 + -2] = dVar10;
          lVar7 = lVar7 + -1;
        } while (this->m_cv_count < lVar7);
      }
    }
    ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
    bVar3 = true;
  }
  else {
LAB_0053e8dd:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ON_NurbsCurve::Extend(
  const ON_Interval& domain
  )

{
  if (IsClosed()) return false;
  bool is_rat = IsRational() ? true : false;
  int dim = Dimension();
  int cvdim = dim+is_rat;

  bool changed = false;
  if (domain[0] < Domain()[0]){
    ClampEnd(0);
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(0),m_knot,1,0.0,domain[0]);
    for (int i = 0; i < Order()-1; i++)
			m_knot[i] = domain[0];
    changed = true;
  }
  if (domain[1] > Domain()[1]){
    ClampEnd(1);
    int i = CVCount() - Order();
    ON_EvaluateNurbsDeBoor(cvdim,Order(),m_cv_stride, CV(i),m_knot + i,-1,0.0,domain[1]);
    for (i = KnotCount()-1; i >= CVCount()-1; i--)
			m_knot[i] = domain[1];
    changed = true;
  }

  if (changed){
    DestroyCurveTree();
  }
  return changed;
}